

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

bool duckdb::CanPropagateCast
               (MultiFileIndexMapping *mapping,LogicalType *param_2,LogicalType *global_type)

{
  InternalException *this;
  bool bVar1;
  string local_40;
  
  if ((param_2->id_ == STRUCT) && (global_type->id_ == STRUCT)) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Propagate cast - check mapping","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = StatisticsPropagator::CanPropagateCast(param_2,global_type);
  return bVar1;
}

Assistant:

bool CanPropagateCast(const MultiFileIndexMapping &mapping, const LogicalType &local_type,
                      const LogicalType &global_type) {
	if (local_type.id() == LogicalTypeId::STRUCT && global_type.id() == LogicalTypeId::STRUCT) {
		// struct fields - check along the mapping
		// mapping is global to local
		throw InternalException("Propagate cast - check mapping");
	}
	return StatisticsPropagator::CanPropagateCast(local_type, global_type);
}